

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::BlindTxInRequest::BlindTxInRequest(BlindTxInRequest *this)

{
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  BlindTxInRequest *local_10;
  BlindTxInRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::BlindTxInRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::BlindTxInRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::BlindTxInRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__BlindTxInRequest_01b4cb90;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->txid_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->vout_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->asset_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->blind_factor_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->asset_blind_factor_,"",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  this->amount_ = 0;
  CollectFieldName();
  return;
}

Assistant:

BlindTxInRequest() {
    CollectFieldName();
  }